

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O1

JavascriptExceptionObject * __thiscall
Js::JavascriptExceptionObject::CloneIfStaticExceptionObject
          (JavascriptExceptionObject *this,ScriptContext *scriptContext)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptExceptionObject *pJVar4;
  JavascriptError *pJVar5;
  Recycler *pRVar6;
  JavascriptExceptionObject *this_01;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                ,0x1a,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00aa14f3;
    *puVar3 = 0;
  }
  this_00 = scriptContext->threadContext;
  pJVar4 = ThreadContext::GetPendingOOMErrorObject(this_00);
  this_01 = this;
  if (pJVar4 == this) {
    if ((this->thrownObject).ptr != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                  ,0x21,"(this->thrownObject == __null)",
                                  "ThrownObject should be NULL since at time of OOM we will not be able to allocate the thrownObject"
                                 );
      if (!bVar2) goto LAB_00aa14f3;
      *puVar3 = 0;
    }
    pJVar5 = JavascriptLibrary::CreateOutOfMemoryError
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4d6bdb1;
    data.filename._0_4_ = 0x2b;
    pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    this_01 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar6,0x38bbb2);
    JavascriptExceptionObject(this_01,pJVar5,scriptContext,&this->exceptionContext,false);
    pJVar4 = ThreadContext::GetPendingOOMErrorObject(this_00);
    ClearError(pJVar4);
  }
  pJVar4 = ThreadContext::GetPendingSOErrorObject(this_00);
  if (pJVar4 == this) {
    if ((this->thrownObject).ptr == (void *)0x0) {
      if (this_00->isThreadBound == true) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                    ,0x35,"(threadContext->IsJSRT())",
                                    "ThrownObject could be NULL for Jsrt scenarios because it is cleared in ~EnterScriptEnd. For non-jsrt cases, we should always have an allocated thrown object."
                                   );
        if (!bVar2) {
LAB_00aa14f3:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pJVar5 = JavascriptLibrary::CreateStackOverflowError
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      pJVar5 = (JavascriptError *)GetThrownObject(this,scriptContext);
    }
    local_58 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4d6bdb1;
    data.filename._0_4_ = 0x41;
    pRVar6 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_58);
    this_01 = (JavascriptExceptionObject *)new<Memory::Recycler>(0x50,pRVar6,0x38bbb2);
    JavascriptExceptionObject(this_01,pJVar5,scriptContext,&this->exceptionContext,false);
    pJVar4 = ThreadContext::GetPendingSOErrorObject(this_00);
    ClearError(pJVar4);
  }
  return this_01;
}

Assistant:

JavascriptExceptionObject* JavascriptExceptionObject::CloneIfStaticExceptionObject(ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        ThreadContext *threadContext = scriptContext->GetThreadContext();
        JavascriptExceptionObject* exceptionObject = this;

        if (this == threadContext->GetPendingOOMErrorObject())
        {
            AssertMsg(this->thrownObject == NULL, "ThrownObject should be NULL since at time of OOM we will not be able to allocate the thrownObject");

            // Let's hope that unwinding has released enough pointers that the
            // recycler will find some memory to allocate the real OutOfMemory object.
            // If not, it will rethrow outOfMemory
            Var thrownObject = scriptContext->GetLibrary()->CreateOutOfMemoryError();
            exceptionObject = RecyclerNew(scriptContext->GetRecycler(),
                JavascriptExceptionObject,
                thrownObject,
                scriptContext,
                &this->exceptionContext);
            threadContext->ClearPendingOOMError();
        }

        if (this == threadContext->GetPendingSOErrorObject())
        {
            Var thrownObject = NULL;

            if (this->thrownObject == NULL)
            {
                AssertMsg(threadContext->IsJSRT(), "ThrownObject could be NULL for Jsrt scenarios because it is cleared in ~EnterScriptEnd. For non-jsrt cases, we should always have an allocated thrown object.");
                thrownObject = scriptContext->GetLibrary()->CreateStackOverflowError();
            }
            else
            {
                thrownObject = this->GetThrownObject(scriptContext);
            }

            exceptionObject = RecyclerNew(scriptContext->GetRecycler(),
                JavascriptExceptionObject,
                thrownObject,
                scriptContext,
                &this->exceptionContext);
            threadContext->ClearPendingSOError();
        }

        return exceptionObject;
    }